

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O0

void * TPZStructMatrixOR<std::complex<double>_>::ThreadData::ThreadWork(void *datavoid)

{
  TPZCompEl *pTVar1;
  bool bVar2;
  int iVar3;
  TPZElementMatrix *this;
  TPZCompEl **ppTVar4;
  TPZElementMatrixT<std::complex<double>_> *pTVar5;
  TPZElementMatrixT<std::complex<double>_> *pTVar6;
  TPZGuiInterface *this_00;
  undefined8 *in_RDI;
  scoped_lock<std::mutex> lock;
  TPZCompEl *el;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> ef;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> ek;
  int64_t nel;
  TPZAutoPointer<TPZGuiInterface> guiInterface;
  TPZCompMesh *cmesh;
  int64_t iel;
  bool computeRhs;
  ThreadData *data;
  TPZVec<long> *in_stack_fffffffffffffea8;
  TPZStructMatrix *in_stack_fffffffffffffeb0;
  TPZManVector<long,_10> *in_stack_fffffffffffffeb8;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffffec0;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffffec8;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffffee0;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffffee8;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffffef0;
  TPZElementMatrixT<std::complex<double>_> *in_stack_ffffffffffffff00;
  int local_64;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> local_58;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> local_50 [3];
  long local_38;
  TPZAutoPointer<TPZGuiInterface> local_30;
  TPZCompMesh *local_28;
  TPZStructMatrix *local_20;
  byte local_11;
  undefined8 *local_10;
  
  local_11 = *(byte *)(in_RDI + 0x22) & 1;
  local_10 = in_RDI;
  local_20 = (TPZStructMatrix *)NextElement((ThreadData *)in_stack_ffffffffffffff00);
  local_28 = ::TPZStructMatrix::Mesh((TPZStructMatrix *)*local_10);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffeb0,
             (TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffea8);
  local_38 = TPZCompMesh::NElements((TPZCompMesh *)0x1d77c59);
  do {
    if (local_38 <= (long)local_20) break;
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *)
               in_stack_fffffffffffffec0);
    this = (TPZElementMatrix *)operator_new(0x81d0);
    TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
              (in_stack_fffffffffffffef0,(TPZCompMesh *)in_stack_fffffffffffffee8,
               (MType)((ulong)in_stack_fffffffffffffee0 >> 0x20));
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *)
               in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (local_10[2] == 0) {
      TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator=
                ((TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *)
                 in_stack_fffffffffffffeb8,
                 (TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *)
                 in_stack_fffffffffffffeb0);
    }
    else {
      operator_new(0x81d0);
      TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
                (in_stack_fffffffffffffef0,(TPZCompMesh *)in_stack_fffffffffffffee8,
                 (MType)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator=
                ((TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *)
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    TPZCompMesh::ElementVec(local_28);
    ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)in_stack_fffffffffffffed0,
                         (int64_t)in_stack_fffffffffffffec8);
    pTVar1 = *ppTVar4;
    if (local_10[2] == 0) {
      pTVar5 = ::TPZAutoPointer::operator_cast_to_TPZElementMatrixT_((TPZAutoPointer *)&local_58);
      (**(code **)(*(long *)pTVar1 + 0x128))(pTVar1,pTVar5);
    }
    else {
      pTVar5 = ::TPZAutoPointer::operator_cast_to_TPZElementMatrixT_((TPZAutoPointer *)local_50);
      pTVar6 = ::TPZAutoPointer::operator_cast_to_TPZElementMatrixT_((TPZAutoPointer *)&local_58);
      (**(code **)(*(long *)pTVar1 + 0x110))(pTVar1,pTVar5,pTVar6);
    }
    bVar2 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&local_30);
    if (bVar2) {
      this_00 = TPZAutoPointer<TPZGuiInterface>::operator->(&local_30);
      bVar2 = TPZGuiInterface::AmIKilled(this_00);
      if (!bVar2) goto LAB_01d77f6c;
      local_64 = 3;
    }
    else {
LAB_01d77f6c:
      iVar3 = (**(code **)(*(long *)pTVar1 + 0x1f0))();
      if (iVar3 == 0) {
        TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator->(local_50);
        TPZElementMatrix::ComputeDestinationIndices(this);
        bVar2 = ::TPZStructMatrix::HasRange((TPZStructMatrix *)0x1d77fc9);
        if (bVar2) {
          TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator->(local_50);
          in_stack_ffffffffffffff00 =
               TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator->(local_50);
          ::TPZStructMatrix::FilterEquations
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(TPZVec<long> *)0x1d7803c);
        }
      }
      else {
        if (local_10[2] != 0) {
          in_stack_fffffffffffffef0 =
               TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator->(local_50);
          (*(in_stack_fffffffffffffef0->super_TPZElementMatrix)._vptr_TPZElementMatrix[6])();
        }
        in_stack_fffffffffffffee8 =
             TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator->(&local_58);
        (*(in_stack_fffffffffffffee8->super_TPZElementMatrix)._vptr_TPZElementMatrix[6])();
        in_stack_fffffffffffffee0 =
             TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator->(local_50);
        TPZElementMatrix::ComputeDestinationIndices(this);
        in_stack_fffffffffffffedf = ::TPZStructMatrix::HasRange((TPZStructMatrix *)0x1d780ce);
        if ((bool)in_stack_fffffffffffffedf) {
          in_stack_fffffffffffffec8 = (TPZElementMatrixT<std::complex<double>_> *)*local_10;
          in_stack_fffffffffffffed0 =
               TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator->(local_50);
          in_stack_fffffffffffffeb8 =
               &(in_stack_fffffffffffffed0->super_TPZElementMatrix).fSourceIndex;
          in_stack_fffffffffffffec0 =
               TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator->(local_50);
          ::TPZStructMatrix::FilterEquations
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(TPZVec<long> *)0x1d78141);
        }
      }
      ComputedElementMatrix
                ((ThreadData *)in_stack_fffffffffffffef0,(int64_t)in_stack_fffffffffffffee8,
                 (TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *)
                 in_stack_fffffffffffffee0,
                 (TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *)
                 CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      in_stack_fffffffffffffeb0 =
           (TPZStructMatrix *)NextElement((ThreadData *)in_stack_ffffffffffffff00);
      local_64 = 0;
      local_20 = in_stack_fffffffffffffeb0;
    }
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *)
               in_stack_fffffffffffffeb0);
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *)
               in_stack_fffffffffffffeb0);
  } while (local_64 == 0);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffeb0,
             (mutex_type *)in_stack_fffffffffffffea8);
  TPZSemaphore::Post((TPZSemaphore *)in_stack_fffffffffffffed0);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x1d78228);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffeb0);
  return (void *)0x0;
}

Assistant:

void *
TPZStructMatrixOR<TVar>::ThreadData::ThreadWork(void *datavoid) {
#ifdef PZDEBUG
    TExceptionManager activateExceptions;
#endif
    ThreadData *data = (ThreadData *) datavoid;
    const bool computeRhs = data->fComputeRhs;
    // compute the next element (this method is threadsafe)
    int64_t iel = data->NextElement();

    TPZCompMesh *cmesh = data->fStruct->Mesh();
    TPZAutoPointer<TPZGuiInterface> guiInterface = data->fGuiInterface;
    int64_t nel = cmesh->NElements();
    while (iel < nel) {

        TPZAutoPointer<TPZElementMatrixT<TVar>> ek;
        TPZAutoPointer<TPZElementMatrixT<TVar>> ef =
            new TPZElementMatrixT<TVar>(cmesh, TPZElementMatrix::EF);
        if (data->fGlobMatrix) {
            ek = new TPZElementMatrixT<TVar>(cmesh, TPZElementMatrix::EK);
        } else {
            ek = ef;
        }

        TPZCompEl *el = cmesh->ElementVec()[iel];

#ifndef DRY_RUN
        if (data->fGlobMatrix) {
            el->CalcStiff(ek, ef);
        } else {
            el->CalcResidual(ef);
        }
#else
        {
            TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (el);
            if (!intel) {
                DebugStop();
            }
            if (data->fGlobMatrix) {
                intel->InitializeElementMatrix(ekr, efr);
            } else {
                intel->InitializeElementMatrix(efr);
            }
        }
#endif

        if (guiInterface) if (guiInterface->AmIKilled()) {
                break;
            }

        if (!el->HasDependency()) {
            ek->ComputeDestinationIndices();

            if (data->fStruct->HasRange()) {
                data->fStruct->FilterEquations(ek->fSourceIndex, ek->fDestinationIndex);
            }
#ifdef PZ_LOG
            if (loggerel.isDebugEnabled()) {
                std::stringstream sout;
                sout << "Element index " << iel << std::endl;
                ek->fMat.Print("Element stiffness matrix", sout);
                if(computeRhs) ef->fMat.Print("Element right hand side", sout);
                LOGPZ_DEBUG(loggerel, sout.str())
            }
#endif
        } else {
            // the element has dependent nodes
            if (data->fGlobMatrix) {
                ek->ApplyConstraints();
            }
            ef->ApplyConstraints();
            ek->ComputeDestinationIndices();
            if (data->fStruct->HasRange()) {
                data->fStruct->FilterEquations(ek->fSourceIndex, ek->fDestinationIndex);
            }
#ifdef PZ_LOG
            if (loggerel2.isDebugEnabled() && el->Reference() && el->Reference()->MaterialId() == 1 && el->IsInterface()) {
                std::stringstream sout;
                el->Reference()->Print(sout);
                el->Print(sout);
                ek->Print(sout);
                //			ef->Print(sout);
                LOGPZ_DEBUG(loggerel2, sout.str())
            }
#endif
#ifdef PZ_LOG
            if (loggerel.isDebugEnabled()) {
                std::stringstream sout;
                sout << "Element index " << iel << std::endl;
                ek->fConstrMat.Print("Element stiffness matrix", sout);
                if(computeRhs) ef->fConstrMat.Print("Element right hand side", sout);
                LOGPZ_DEBUG(loggerel, sout.str())
            }
#endif
        }


        // put the elementmatrices on the stack to be assembled (threadsafe)
        data->ComputedElementMatrix(iel, ek, ef);
        // compute the next element (this method is threadsafe)
        iel = data->NextElement();
    }

    {
      std::scoped_lock lock(data->fMutexAccessElement);
      data->fAssembly.Post();
    }

    return 0;
}